

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLargeDataWindowOffsets.cpp
# Opt level: O0

ChannelList *
anon_unknown.dwarf_212e3b::setupBuffer
          (Header *hdr,char **channels,PixelType *pt,FrameBuffer *buf,bool writing)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Box2i *pBVar5;
  long in_RCX;
  long in_RDX;
  ChannelList *in_RDI;
  byte in_R9B;
  float fVar6;
  bool in_stack_00000086;
  bool in_stack_00000087;
  double in_stack_00000088;
  int64_t in_stack_00000090;
  int64_t in_stack_00000098;
  V2i *in_stack_000000a0;
  void *in_stack_000000a8;
  PixelType in_stack_000000b4;
  size_t in_stack_000000c0;
  size_t in_stack_000000c8;
  int in_stack_000000d0;
  int in_stack_000000d8;
  PixelType type;
  size_t i_1;
  char *offset;
  int64_t bytes_per_row;
  int64_t width;
  unsigned_short values;
  half v;
  size_t i;
  size_t chan;
  char *write_ptr;
  size_t size;
  size_t samples;
  size_t activechans;
  char *in_stack_00000138;
  Box2i dw;
  ChannelList *chanlist;
  Box<Imath_2_5::Vec2<int>_> *in_stack_fffffffffffffe88;
  Box<Imath_2_5::Vec2<int>_> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  PixelType local_12c;
  char *local_128;
  float *local_120;
  Channel local_ac;
  PixelType local_9c;
  ulong local_98;
  char *local_90;
  long local_88;
  long local_80;
  undefined1 local_77;
  unsigned_short local_76;
  unsigned_short local_74;
  half local_72;
  ulong local_70;
  ulong local_68;
  float *local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  int local_3c;
  int local_34;
  byte local_29;
  long local_20;
  long local_18;
  
  local_29 = in_R9B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  Imf_2_5::Header::dataWindow((Header *)0x2224b5);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  for (local_48 = 0; *(long *)(local_18 + local_48 * 8) != 0; local_48 = local_48 + 1) {
  }
  pBVar5 = Imf_2_5::Header::dataWindow((Header *)0x22250b);
  iVar4 = (pBVar5->max).x;
  pBVar5 = Imf_2_5::Header::dataWindow((Header *)0x222522);
  iVar1 = (pBVar5->min).x;
  pBVar5 = Imf_2_5::Header::dataWindow((Header *)0x22253f);
  iVar2 = (pBVar5->max).y;
  pBVar5 = Imf_2_5::Header::dataWindow((Header *)0x222556);
  local_50 = (long)((iVar4 + 1) - iVar1) * (long)((iVar2 + 1) - (pBVar5->min).y) * local_48;
  local_58 = local_50 * 4;
  if ((local_29 & 1) == 0) {
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  else {
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  if ((local_29 & 1) == 0) {
    local_120 = (float *)std::vector<char,_std::allocator<char>_>::operator[]
                                   ((vector<char,_std::allocator<char>_> *)
                                    (anonymous_namespace)::readingBuffer,0);
  }
  else {
    local_120 = (float *)std::vector<char,_std::allocator<char>_>::operator[]
                                   ((vector<char,_std::allocator<char>_> *)
                                    (anonymous_namespace)::writingBuffer,0);
  }
  local_60 = local_120;
  local_68 = 0;
  for (local_70 = 0; local_70 < local_50; local_70 = local_70 + 1) {
    do {
      std::numeric_limits<unsigned_short>::max();
      iVar4 = random_int((int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
      local_74 = (unsigned_short)iVar4;
      half::setBits(&local_72,local_74);
      bVar3 = half::isNan(&local_72);
    } while (bVar3);
    if ((local_20 == 0) || (*(int *)(local_20 + local_68 * 4) == 1)) {
      local_76 = local_72._h;
      *(unsigned_short *)local_60 = local_72._h;
    }
    else {
      fVar6 = half::operator_cast_to_float(&local_72);
      *local_60 = fVar6;
    }
    local_68 = local_68 + 1;
    local_60 = local_60 + 1;
    if (local_68 == local_48) {
      local_68 = 0;
    }
  }
  local_77 = 0;
  Imf_2_5::ChannelList::ChannelList((ChannelList *)0x222745);
  local_80 = (long)((local_34 + 1) - local_3c);
  local_88 = local_48 * 4 * local_80;
  if ((local_29 & 1) == 0) {
    local_128 = std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)0x2227a6);
  }
  else {
    local_128 = std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)0x222793);
  }
  local_90 = local_128;
  for (local_98 = 0; local_98 < local_48; local_98 = local_98 + 1) {
    if (local_20 == 0) {
      local_12c = HALF;
    }
    else {
      local_12c = *(PixelType *)(local_20 + local_98 * 4);
    }
    local_9c = local_12c;
    Imf_2_5::Channel::Channel(&local_ac,local_12c,1,1,false);
    Imf_2_5::ChannelList::insert((ChannelList *)dw._4_8_,in_stack_00000138,(Channel *)activechans);
    Imf_2_5::Slice::Make
              (in_stack_000000b4,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
               in_stack_00000090,in_stack_000000c0,in_stack_000000c8,in_stack_000000d0,
               in_stack_000000d8,in_stack_00000088,in_stack_00000087,in_stack_00000086);
    Imf_2_5::FrameBuffer::insert((FrameBuffer *)dw._4_8_,in_stack_00000138,(Slice *)activechans);
    local_90 = local_90 + 4;
  }
  return in_RDI;
}

Assistant:

ChannelList
setupBuffer (const Header& hdr,       // header to grab datawindow from
             const char * const *channels, // NULL terminated list of channels to write
             const PixelType *pt,
             FrameBuffer& buf,        // buffer to fill with pointers to channel
             bool writing                  // true if should allocate
            )
{
    Box2i dw = hdr.dataWindow();

    //
    // how many channels in total
    //
    size_t activechans = 0;
    
    while (channels[activechans]!=NULL)
    {
        activechans++;
    }

    size_t samples = size_t(hdr.dataWindow().max.x+1-hdr.dataWindow().min.x)*
                  size_t(hdr.dataWindow().max.y+1-hdr.dataWindow().min.y)*activechans;

    // always allocate four bytes for each sample, even half types. to keep floats word-aligned
    size_t size =samples * 4;

    
    if (writing)
    {
        writingBuffer.resize(size);
    }
    else
    {
        readingBuffer.resize(size);
    }
   
     const char * write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
     // fill with random halfs, casting to floats for float channels - don't write NaN values
     size_t chan=0;
     for (size_t i=0;i<samples;i++)
     {

         half v;
         do
         {
           unsigned short int values = random_int(std::numeric_limits<unsigned short>::max());
           v.setBits(values);
         }
         while ( v.isNan() );

         if (pt==NULL || pt[chan]==IMF::HALF)
         {
             *(half*)write_ptr = half(v);
         }
         else
         {
             *(float*)write_ptr = float(v);
         }
         chan++;
         write_ptr += 4;
         if (chan==activechans)
         {
             chan=0;
         }
        
     }

     

    ChannelList chanlist;

    int64_t width = (dw.max.x+1-dw.min.x);
    int64_t bytes_per_row = activechans * 4 * width;
   
    const char* offset = ( writing ? writingBuffer.data() : readingBuffer.data() ); 
    for (size_t i=0;i<activechans;i++)
    {
        PixelType type = pt==NULL ? IMF::HALF : pt[i];

        chanlist.insert(channels[i],type);
        buf.insert (channels[i],
                    Slice::Make (type,
                                 offset,
                                 dw.min,
                                 width,1,
                                 activechans * 4,
                                 bytes_per_row,
                                 1,
                                 1,
                                 100.+i,false,false
                                )
                    );
        offset += 4;
   }

    return chanlist;
}